

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O1

void test_1(void)

{
  ChStreamOutAscii *pCVar1;
  ChBody *__p;
  ChMesh **size;
  undefined1 auVar2 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeA;
  shared_ptr<chrono::fea::ChElementSpring> melementA;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraintA;
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::ChSolverMINRES> solver;
  ChSystemSMC sys;
  ChNodeFEAxyz *local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  ChNodeFEAxyz *local_4f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  ChElementSpring *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  ChMesh *local_4d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  ChLinkPointFrame *local_4c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c0;
  ChBody *local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  ChSolverMINRES *local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  ChSolverMINRES *local_498;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_490;
  ChLinkPointFrame *local_488;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_480;
  ChBody *local_478;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_470;
  ChNodeFEAxyz *local_468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_460;
  ChBody *local_458;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_450;
  ChMesh *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  ChElementSpring *local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_430;
  ChNodeFEAxyz *local_428;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_420;
  ChNodeFEAxyz *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_410;
  ChNodeFEAxyz *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  ChNodeFEAxyz *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  ChVector<double> local_3e8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  code *local_3b8 [116];
  long *local_18;
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: spring element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC((ChSystemSMC *)local_3b8,true);
  local_4d8 = (ChMesh *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChMesh,std::allocator<chrono::fea::ChMesh>>
            (&local_4d0,&local_4d8,(allocator<chrono::fea::ChMesh> *)&local_3e8);
  local_3e8.m_data[2] = 0.0;
  local_3e8.m_data[0] = 0.0;
  local_3e8.m_data[1] = 0.0;
  local_4f8 = (ChNodeFEAxyz *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&local_4f0,&local_4f8,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_508,&local_3e8);
  local_3e8.m_data[0] = 0.0;
  local_3e8.m_data[1] = 1.0;
  local_3e8.m_data[2] = 0.0;
  local_508 = (ChNodeFEAxyz *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&local_500,&local_508,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_4e8,&local_3e8);
  (**(code **)(*(long *)local_4f8 + 0x50))(0x3f847ae147ae147b);
  (**(code **)(*(long *)local_508 + 0x50))(0x3f847ae147ae147b);
  local_3d0 = 0;
  local_3c8 = 0x4014000000000000;
  local_3c0 = 0;
  (**(code **)(*(long *)local_508 + 0x68))();
  local_3f8 = local_4f8;
  local_3f0 = local_4f0._M_pi;
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4f0._M_pi)->_M_use_count = (local_4f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4f0._M_pi)->_M_use_count = (local_4f0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode(local_4d8,&local_3f8);
  if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
  }
  local_408 = local_508;
  local_400 = local_500._M_pi;
  if (local_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_500._M_pi)->_M_use_count = (local_500._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_500._M_pi)->_M_use_count = (local_500._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode(local_4d8,&local_408);
  if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
  }
  local_4e8 = (ChElementSpring *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChElementSpring,std::allocator<chrono::fea::ChElementSpring>>
            (&local_4e0,&local_4e8,(allocator<chrono::fea::ChElementSpring> *)&local_3e8);
  local_418 = local_4f8;
  local_410 = local_4f0._M_pi;
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4f0._M_pi)->_M_use_count = (local_4f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4f0._M_pi)->_M_use_count = (local_4f0._M_pi)->_M_use_count + 1;
    }
  }
  local_428 = local_508;
  local_420 = local_500._M_pi;
  if (local_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_500._M_pi)->_M_use_count = (local_500._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_500._M_pi)->_M_use_count = (local_500._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_4e8 + 0xb0))(local_4e8,&local_418,&local_428);
  if (local_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420);
  }
  if (local_410 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410);
  }
  (**(code **)(*(long *)local_4e8 + 0xb8))(0x40f86a0000000000);
  local_438 = local_4e8;
  local_430 = local_4e0._M_pi;
  if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4e0._M_pi)->_M_use_count = (local_4e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4e0._M_pi)->_M_use_count = (local_4e0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddElement(local_4d8,&local_438);
  if (local_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430);
  }
  local_448 = local_4d8;
  local_440 = local_4d0._M_pi;
  if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4d0._M_pi)->_M_use_count = (local_4d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4d0._M_pi)->_M_use_count = (local_4d0._M_pi)->_M_use_count + 1;
    }
  }
  size = &local_448;
  chrono::ChSystem::Add(local_3b8);
  if (local_440 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440);
  }
  __p = (ChBody *)chrono::ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)size);
  chrono::ChBody::ChBody(__p,0);
  local_4b8 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>(&local_4b0,__p);
  chrono::ChBody::SetBodyFixed(SUB81(local_4b8,0));
  local_458 = local_4b8;
  local_450 = local_4b0._M_pi;
  if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4b0._M_pi)->_M_use_count = (local_4b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4b0._M_pi)->_M_use_count = (local_4b0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b8,&local_458);
  if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450);
  }
  local_4c8 = (ChLinkPointFrame *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&local_4c0,&local_4c8,(allocator<chrono::fea::ChLinkPointFrame> *)&local_3e8);
  local_468 = local_4f8;
  local_460 = local_4f0._M_pi;
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4f0._M_pi)->_M_use_count = (local_4f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4f0._M_pi)->_M_use_count = (local_4f0._M_pi)->_M_use_count + 1;
    }
  }
  local_478 = local_4b8 + 0x78;
  if (local_4b8 == (ChBody *)0x0) {
    local_478 = (ChBody *)0x0;
  }
  local_470 = local_4b0._M_pi;
  if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4b0._M_pi)->_M_use_count = (local_4b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4b0._M_pi)->_M_use_count = (local_4b0._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_4c8 + 0x220))(local_4c8,&local_468,&local_478,0);
  if (local_470 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470);
  }
  if (local_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460);
  }
  local_488 = local_4c8;
  local_480 = local_4c0._M_pi;
  if (local_4c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4c0._M_pi)->_M_use_count = (local_4c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4c0._M_pi)->_M_use_count = (local_4c0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b8,&local_488);
  if (local_480 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_480);
  }
  local_4a8 = (ChSolverMINRES *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChSolverMINRES,std::allocator<chrono::ChSolverMINRES>>
            (&local_4a0,&local_4a8,(allocator<chrono::ChSolverMINRES> *)&local_3e8);
  local_498 = local_4a8 + 0x18;
  if (local_4a8 == (ChSolverMINRES *)0x0) {
    local_498 = (ChSolverMINRES *)0x0;
  }
  local_490 = local_4a0._M_pi;
  if (local_4a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4a0._M_pi)->_M_use_count = (local_4a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4a0._M_pi)->_M_use_count = (local_4a0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::SetSolver(local_3b8,&local_498);
  if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
  }
  *(undefined4 *)(local_4a8 + 0xc) = 0x28;
  *(undefined8 *)(local_4a8 + 0x10) = 0x3ddb7cdfd9d7bdbb;
  local_4a8[8] = (ChSolverMINRES)0x1;
  local_4a8[0x20] = (ChSolverMINRES)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"poss after linear static analysis: \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,"  nodeA->pos \n");
  chrono::operator<<(pCVar1,(ChVector<double> *)(local_4f8 + 0x20));
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,"  nodeB->pos \n");
  chrono::operator<<(pCVar1,(ChVector<double> *)(local_508 + 0x20));
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"Forces after linear static analysis: \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,"  constraintA.react \n")
  ;
  auVar2._0_8_ = *(ulong *)(local_4c8 + 0x88) ^ 0x8000000000000000;
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_3e8.m_data[0] = -*(double *)(local_4c8 + 0x78);
  local_3e8.m_data[1] = -*(double *)(local_4c8 + 0x80);
  local_3e8.m_data[2] = (double)vmovlps_avx(auVar2);
  chrono::operator<<(pCVar1,&local_3e8);
  if (local_4a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0._M_pi);
  }
  if (local_4c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c0._M_pi);
  }
  if (local_4b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0._M_pi);
  }
  if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0._M_pi);
  }
  if (local_500._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_500._M_pi);
  }
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0._M_pi);
  }
  if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d0._M_pi);
  }
  local_3b8[0] = chrono::ChSystemSMC::ChSystemSMC;
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  local_18 = (long *)0x0;
  chrono::ChSystem::~ChSystem((ChSystem *)local_3b8);
  return;
}

Assistant:

void test_1() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: spring element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnodeA = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnodeB = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 1, 0));

    // For example, you can attach local 'point masses' (FE node masses are zero by default)
    mnodeA->SetMass(0.01);
    mnodeB->SetMass(0.01);

    // For example, set an applied force to a node:
    mnodeB->SetForce(ChVector<>(0, 5, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnodeA);
    my_mesh->AddNode(mnodeB);

    // Create some elements of 'spring-damper' type, each connecting
    // two 3D nodes:
    auto melementA = chrono_types::make_shared<ChElementSpring>();
    melementA->SetNodes(mnodeA, mnodeB);
    melementA->SetSpringK(100000);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melementA);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    truss->SetBodyFixed(true);
    sys.Add(truss);

    // Create a constraint between a node and the truss
    auto constraintA = chrono_types::make_shared<ChLinkPointFrame>();

    constraintA->Initialize(mnodeA,  // node to connect
                            truss);  // body to be connected to

    sys.Add(constraintA);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(40);
    solver->SetTolerance(1e-10);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    GetLog() << "poss after linear static analysis: \n";
    GetLog() << "  nodeA->pos \n" << mnodeA->GetPos();
    GetLog() << "  nodeB->pos \n" << mnodeB->GetPos();
    GetLog() << "Forces after linear static analysis: \n";
    GetLog() << "  constraintA.react \n" << constraintA->GetReactionOnBody();
}